

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_ATTEST_Marshal(TPMU_ATTEST *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_ATTEST *source_local;
  
  switch(selector) {
  case 0x8014:
    source_local._6_2_ = TPMS_NV_CERTIFY_INFO_Marshal(&source->nv,buffer,size);
    break;
  case 0x8015:
    source_local._6_2_ = TPMS_COMMAND_AUDIT_INFO_Marshal(&source->commandAudit,buffer,size);
    break;
  case 0x8016:
    source_local._6_2_ = TPMS_SESSION_AUDIT_INFO_Marshal(&source->sessionAudit,buffer,size);
    break;
  case 0x8017:
    source_local._6_2_ = TPMS_CERTIFY_INFO_Marshal(&source->certify,buffer,size);
    break;
  case 0x8018:
    source_local._6_2_ = TPMS_QUOTE_INFO_Marshal(&source->quote,buffer,size);
    break;
  case 0x8019:
    source_local._6_2_ = TPMS_TIME_ATTEST_INFO_Marshal(&source->time,buffer,size);
    break;
  case 0x801a:
    source_local._6_2_ = TPMS_CREATION_INFO_Marshal(&source->creation,buffer,size);
    break;
  default:
    source_local._6_2_ = 0;
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_ATTEST_Marshal(TPMU_ATTEST *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
        case TPM_ST_ATTEST_CERTIFY:
            return TPMS_CERTIFY_INFO_Marshal((TPMS_CERTIFY_INFO *)&(source->certify), buffer, size);
        case TPM_ST_ATTEST_CREATION:
            return TPMS_CREATION_INFO_Marshal((TPMS_CREATION_INFO *)&(source->creation), buffer, size);
        case TPM_ST_ATTEST_QUOTE:
            return TPMS_QUOTE_INFO_Marshal((TPMS_QUOTE_INFO *)&(source->quote), buffer, size);
        case TPM_ST_ATTEST_COMMAND_AUDIT:
            return TPMS_COMMAND_AUDIT_INFO_Marshal((TPMS_COMMAND_AUDIT_INFO *)&(source->commandAudit), buffer, size);
        case TPM_ST_ATTEST_SESSION_AUDIT:
            return TPMS_SESSION_AUDIT_INFO_Marshal((TPMS_SESSION_AUDIT_INFO *)&(source->sessionAudit), buffer, size);
        case TPM_ST_ATTEST_TIME:
            return TPMS_TIME_ATTEST_INFO_Marshal((TPMS_TIME_ATTEST_INFO *)&(source->time), buffer, size);
        case TPM_ST_ATTEST_NV:
            return TPMS_NV_CERTIFY_INFO_Marshal((TPMS_NV_CERTIFY_INFO *)&(source->nv), buffer, size);
    }
    return 0;
}